

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O3

string * __thiscall
Diligent::FormatString<char[29],char_const*,char[24],char_const*,char[21],char_const*,char[91]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [29],char **Args_1,
          char (*Args_2) [24],char **Args_3,char (*Args_4) [21],char **Args_5,char (*Args_6) [91])

{
  stringstream ss;
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  FormatStrSS<std::__cxx11::stringstream,char[29],char_const*,char[24],char_const*,char[21],char_const*,char[91]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
             (char (*) [29])this,(char **)Args,(char (*) [24])Args_1,(char **)Args_2,
             (char (*) [21])Args_3,(char **)Args_4,(char (*) [91])Args_5);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}